

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O0

ares_status_t
parse_nsswitch_line(ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_buf_t *line)

{
  ares_bool_t aVar1;
  size_t sVar2;
  undefined8 *puVar3;
  ares_buf_t *buf;
  ares_buf_t **bufptr;
  ares_array_t *sects;
  char local_48 [4];
  ares_status_t status;
  char option [32];
  ares_buf_t *line_local;
  ares_sysconfig_t *sysconfig_local;
  ares_channel_t *channel_local;
  
  sects._4_4_ = 0;
  bufptr = (ares_buf_t **)0x0;
  option._24_8_ = line;
  aVar1 = ares_buf_begins_with(line,"#",1);
  if (aVar1 == ARES_FALSE) {
    sects._4_4_ = ares_buf_split((ares_buf_t *)option._24_8_,(uchar *)":",1,ARES_BUF_SPLIT_TRIM,2,
                                 (ares_array_t **)&bufptr);
    if ((sects._4_4_ == ARES_SUCCESS) &&
       (sVar2 = ares_array_len((ares_array_t *)bufptr), sVar2 == 2)) {
      puVar3 = (undefined8 *)ares_array_at((ares_array_t *)bufptr,0);
      sects._4_4_ = buf_fetch_string((ares_buf_t *)*puVar3,local_48,0x20);
      if ((sects._4_4_ == ARES_SUCCESS) &&
         (aVar1 = ares_streq(local_48,"hosts"), aVar1 != ARES_FALSE)) {
        puVar3 = (undefined8 *)ares_array_at((ares_array_t *)bufptr,1);
        sects._4_4_ = config_lookup(sysconfig,(ares_buf_t *)*puVar3," \t");
      }
    }
    ares_array_destroy((ares_array_t *)bufptr);
    if (sects._4_4_ != ARES_ENOMEM) {
      sects._4_4_ = ARES_SUCCESS;
    }
    channel_local._4_4_ = sects._4_4_;
  }
  else {
    channel_local._4_4_ = ARES_SUCCESS;
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t parse_nsswitch_line(const ares_channel_t *channel,
                                         ares_sysconfig_t     *sysconfig,
                                         ares_buf_t           *line)
{
  char          option[32];
  ares_status_t status = ARES_SUCCESS;
  ares_array_t *sects  = NULL;
  ares_buf_t  **bufptr;
  ares_buf_t   *buf;

  (void)channel;

  /* Ignore lines beginning with a comment */
  if (ares_buf_begins_with(line, (const unsigned char *)"#", 1)) {
    return ARES_SUCCESS;
  }

  /* database : values (space delimited) */
  status = ares_buf_split(line, (const unsigned char *)":", 1,
                          ARES_BUF_SPLIT_TRIM, 2, &sects);

  if (status != ARES_SUCCESS || ares_array_len(sects) != 2) {
    goto done;
  }

  bufptr = ares_array_at(sects, 0);
  buf    = *bufptr;

  status = buf_fetch_string(buf, option, sizeof(option));
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Only support "hosts:" */
  if (!ares_streq(option, "hosts")) {
    goto done;
  }

  /* Values are space separated */
  bufptr = ares_array_at(sects, 1);
  buf    = *bufptr;
  status = config_lookup(sysconfig, buf, " \t");

done:
  ares_array_destroy(sects);
  if (status != ARES_ENOMEM) {
    status = ARES_SUCCESS;
  }
  return status;
}